

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacMessage0.c
# Opt level: O3

_Bool COSE_Mac0_Free(HCOSE_MAC0 h)

{
  _Bool _Var1;
  COSE_Mac0Message *p;
  
  _Var1 = _COSE_IsInList(Mac0Root,(COSE *)h);
  if (_Var1) {
    if (*(int *)(h + 0x10) < 2) {
      _COSE_RemoveFromList(&Mac0Root,(COSE *)h);
      _COSE_Release((COSE *)h);
      free(h);
    }
    else {
      *(int *)(h + 0x10) = *(int *)(h + 0x10) + -1;
    }
  }
  return _Var1;
}

Assistant:

bool COSE_Mac0_Free(HCOSE_MAC0 h)
{
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context *context;
#endif
	COSE_Mac0Message * p = (COSE_Mac0Message *)h;

	if (!IsValidMac0Handle(h)) return false;

	if (p->m_message.m_refCount > 1) {
		p->m_message.m_refCount--;
		return true;
	}

	_COSE_RemoveFromList(&Mac0Root, &p->m_message);

#ifdef USE_CBOR_CONTEXT
	context = &p->m_message.m_allocContext;
#endif

	_COSE_Mac0_Release(p);

	COSE_FREE(p, context);

	return true;
}